

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::BufferData::BufferData
          (BufferData *this,SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer,GLenum target,
          GLsizeiptr size,GLenum usage,bool useSync,bool serverSync)

{
  GLsizeiptr GVar1;
  Buffer *pBVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50 [2];
  undefined1 local_2e;
  undefined1 local_2d;
  GLenum local_2c;
  bool serverSync_local;
  bool useSync_local;
  GLsizeiptr GStack_28;
  GLenum usage_local;
  GLsizeiptr size_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *pSStack_18;
  GLenum target_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer_local;
  BufferData *this_local;
  
  local_2e = serverSync;
  local_2d = useSync;
  local_2c = usage;
  GStack_28 = size;
  size_local._4_4_ = target;
  pSStack_18 = buffer;
  buffer_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)this;
  Operation::Operation(&this->super_Operation,"BufferData",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation = (_func_int **)&PTR__BufferData_006701b0;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr(&this->m_buffer,buffer);
  this->m_target = size_local._4_4_;
  this->m_size = GStack_28;
  this->m_usage = local_2c;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>
            (local_50,&this->m_buffer);
  Operation::modifyGLObject(&this->super_Operation,local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_50);
  pBVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(buffer);
  GVar1 = GStack_28;
  pBVar2->isDefined = true;
  pBVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(buffer);
  pBVar2->size = GVar1;
  return;
}

Assistant:

BufferData::BufferData (SharedPtr<Buffer> buffer, GLenum target, GLsizeiptr size, GLenum usage, bool useSync, bool serverSync)
	: Operation	("BufferData", useSync, serverSync)
	, m_buffer	(buffer)
	, m_target	(target)
	, m_size	(size)
	, m_usage	(usage)
{
	modifyGLObject(SharedPtr<Object>(m_buffer));
	buffer->isDefined	= true;
	buffer->size		= size;
}